

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::AddContact(ChContactContainerNSC *this,ChCollisionInfo *cinfo)

{
  ChContactable *pCVar1;
  ChContactable *pCVar2;
  ChMaterialCompositionStrategy *strategy;
  element_type *peVar3;
  int iVar4;
  ChMaterialCompositeNSC cmat;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_98;
  shared_ptr<chrono::ChMaterialSurface> local_88;
  shared_ptr<chrono::ChMaterialSurface> local_78;
  ChMaterialCompositeNSC local_68;
  
  pCVar1 = cinfo->modelA->mcontactable;
  if (pCVar1 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelA->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                  ,0xe0,
                  "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &)"
                 );
  }
  pCVar2 = cinfo->modelB->mcontactable;
  if (pCVar2 != (ChContactable *)0x0) {
    iVar4 = (*pCVar1->_vptr_ChContactable[2])();
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*pCVar2->_vptr_ChContactable[2])(pCVar2), (char)iVar4 == '\0')) {
      return;
    }
    iVar4 = (*((cinfo->shapeA->m_material).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ChMaterialSurface[3])();
    if ((iVar4 == 0) &&
       (iVar4 = (*((cinfo->shapeB->m_material).
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->_vptr_ChMaterialSurface[3])(), iVar4 == 0)) {
      strategy = (((this->super_ChContactContainer).super_ChPhysicsItem.system)->
                 composition_strategy)._M_t.
                 super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl
      ;
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,
                 &(cinfo->shapeA->m_material).
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
      std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>(&local_78);
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,
                 &(cinfo->shapeB->m_material).
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
      std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>(&local_88);
      ChMaterialCompositeNSC::ChMaterialCompositeNSC
                (&local_68,strategy,(shared_ptr<chrono::ChMaterialSurfaceNSC> *)&local_78,
                 (shared_ptr<chrono::ChMaterialSurfaceNSC> *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
                (&local_a8,this);
      peVar3 = local_a8._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      if (peVar3 != (element_type *)0x0) {
        (*(this->super_ChContactContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x43])
                  (&local_a8,this);
        (*(local_a8._M_ptr)->_vptr_ChMaterialSurface[2])(local_a8._M_ptr,cinfo,&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      }
      InsertContact(this,cinfo,&local_68);
    }
    return;
  }
  __assert_fail("cinfo.modelB->GetContactable()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                ,0xe1,
                "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &)"
               );
}

Assistant:

void ChContactContainerNSC::AddContact(const collision::ChCollisionInfo& cinfo) {
    assert(cinfo.modelA->GetContactable());
    assert(cinfo.modelB->GetContactable());

    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // Do nothing if any of the contactables is not contact-active
    if (!contactableA->IsContactActive() && !contactableB->IsContactActive())
        return;

    // Check that the two collision models are compatible with complementarity contact.
    if (cinfo.shapeA->GetContactMethod() != ChContactMethod::NSC ||
        cinfo.shapeB->GetContactMethod() != ChContactMethod::NSC) {
        return;
    }

    // Create the composite material
    ChMaterialCompositeNSC cmat(GetSystem()->composition_strategy.get(),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(cinfo.shapeA->GetMaterial()),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(cinfo.shapeB->GetMaterial()));

    // Check for a user-provided callback to modify the material
    if (GetAddContactCallback()) {
        GetAddContactCallback()->OnAddContact(cinfo, &cmat);
    }

    InsertContact(cinfo, cmat);
}